

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_struct_as_typed_root
              (void *buf,size_t bufsiz,flatbuffers_thash_t thash,size_t size,uint16_t align)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (uint)bufsiz;
  if ((bufsiz - 8 >> 4 < 0xfffffff && ((ulong)buf & 3) == 0) &&
     ((thash == 0 || (*(flatbuffers_thash_t *)((long)buf + 4) == thash)))) {
    uVar1 = *buf;
    iVar2 = 0x12;
    if (uVar1 - 1 < uVar4) {
      iVar2 = 10;
      uVar3 = (uint)size + uVar1;
      if (!CARRY4((uint)size,uVar1)) {
        if (uVar3 <= uVar4) {
          iVar2 = 0xb;
          if ((uVar1 & align - 1) == 0) {
            iVar2 = 0;
          }
          return iVar2;
        }
        return (uVar3 <= uVar4) + 9;
      }
    }
  }
  else {
    iVar2 = 5;
    if ((((ulong)buf & 3) == 0) && (iVar2 = 6 - (uint)(bufsiz < 0xfffffff8), bufsiz < 0xfffffff8)) {
      if (bufsiz < 8) {
        iVar2 = 1;
      }
      else {
        if ((thash == 0) || (*(flatbuffers_thash_t *)((long)buf + 4) == thash)) {
          return 0;
        }
        iVar2 = 2;
      }
    }
  }
  return iVar2;
}

Assistant:

int flatcc_verify_typed_buffer_header(const void *buf, size_t bufsiz, flatbuffers_thash_t thash)
{
    thash_t id, id2;

    verify_runtime(!(((size_t)buf) & (offset_size - 1)), flatcc_verify_error_runtime_buffer_header_not_aligned);
    /* -8 ensures no scalar or offset field size can overflow. */
    verify_runtime(bufsiz <= FLATBUFFERS_UOFFSET_MAX - 8, flatcc_verify_error_runtime_buffer_size_too_large);
    /*
     * Even if we specify no fid, the user might later. Therefore
     * require space for it. Not all buffer generators will take this
     * into account, so it is possible to fail an otherwise valid buffer
     * - but such buffers aren't safe.
     */
    verify(bufsiz >= offset_size + FLATBUFFERS_IDENTIFIER_SIZE, flatcc_verify_error_buffer_header_too_small);
    if (thash != 0) {
        id2 = thash;
        id = read_thash(buf, offset_size);
        verify(id2 == 0 || id == id2, flatcc_verify_error_identifier_mismatch);
    }
    return flatcc_verify_ok;
}